

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

undefined8 to_hex<long>(long t)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  long in_RSI;
  undefined8 in_RDI;
  ostringstream ostm;
  ostringstream local_188 [376];
  long local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar3 = std::operator<<((ostream *)local_188,"0x");
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  _Var2 = std::setw(0x10);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string to_hex(T t)
{
	std::ostringstream ostm;
	ostm << "0x" << std::setfill('0') << std::hex << std::setw(sizeof(t) <= 4 ? 8 : 16) << t;
	return ostm.str();
}